

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseTypeCase::iterate(BaseTypeCase *this)

{
  TestLog *pTVar1;
  char *pcVar2;
  RenderContext *renderCtx;
  bool bVar3;
  bool bVar4;
  ContextType CVar5;
  GLSLVersion version;
  int iVar6;
  deUint32 err;
  long *plVar7;
  mapped_type *pmVar8;
  char *pcVar9;
  undefined4 extraout_var;
  ostream *this_00;
  NotSupportedError *this_01;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long lVar13;
  size_type *psVar14;
  long lVar15;
  GLint type;
  vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  samplerTypes;
  GLuint uniformIndex;
  int uniforms;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  shaderArgs;
  ScopedLogSection section;
  string vertexSource;
  string fragmentSource;
  ostringstream buf;
  ShaderProgram program;
  ResultCollector result;
  int local_424;
  void *local_420;
  long local_418;
  long local_410;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  undefined4 local_3dc;
  code *local_3d8;
  value_type local_3d0;
  undefined1 local_3b0 [32];
  _Base_ptr local_390;
  size_t local_388;
  long *local_380;
  long local_378;
  long local_370;
  long lStack_368;
  long *local_360;
  long local_358;
  long local_350;
  long lStack_348;
  ScopedLogSection local_340;
  undefined1 *local_338;
  undefined8 local_330;
  undefined1 local_328;
  undefined7 uStack_327;
  string local_318;
  string local_2f8;
  long local_2d8;
  undefined1 local_2d0 [8];
  _func_int **local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0 [6];
  ios_base local_260 [8];
  ios_base local_258 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_240;
  undefined1 local_220 [208];
  undefined1 local_150 [152];
  deUint32 local_b8;
  bool local_90;
  ResultCollector local_80;
  long lVar10;
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_2d0 = (undefined1  [8])local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,0x1af8059);
  tcu::ResultCollector::ResultCollector(&local_80,pTVar1,(string *)local_2d0);
  if (local_2d0 != (undefined1  [8])local_2c0) {
    operator_delete((void *)local_2d0,local_2c0[0]._M_allocated_capacity + 1);
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&local_420,this);
  CVar5.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(CVar5,(ApiType)0x23);
  if (this->m_extension != (char *)0x0) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,this->m_extension);
    if (!bVar4 && !bVar3) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_150,this->m_extension,(allocator<char> *)local_3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                     "Test requires ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150)
      ;
      tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_2d0);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  if (0 < (int)((ulong)(local_418 - (long)local_420) >> 3) * -0x55555555) {
    lVar13 = 0;
    do {
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_408._0_8_ = glu::getShaderVarTypeName;
      local_408._8_4_ = *(int *)((long)local_420 + lVar13 * 0x18);
      local_2d8 = lVar13;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)local_2d0,local_408);
      local_3d8 = glu::getShaderVarTypeName;
      local_3d0._M_dataplus._M_p._0_4_ = *(undefined4 *)((long)local_420 + lVar13 * 0x18);
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)local_3b0,&local_3d8);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_3b0,0,(char *)0x0,0x1c5dc62);
      local_150._0_8_ = local_150 + 0x10;
      psVar14 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar14) {
        local_150._16_8_ = *psVar14;
        local_150._24_8_ = plVar7[3];
      }
      else {
        local_150._16_8_ = *psVar14;
        local_150._0_8_ = (size_type *)*plVar7;
      }
      local_150._8_8_ = plVar7[1];
      *plVar7 = (long)psVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection
                (&local_340,pTVar1,(string *)local_2d0,(string *)local_150);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
        operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
      }
      if (local_2d0 != (undefined1  [8])local_2c0) {
        operator_delete((void *)local_2d0,local_2c0[0]._M_allocated_capacity + 1);
      }
      local_3b0._8_4_ = _S_red;
      local_3b0._16_8_ = 0;
      local_3b0._24_8_ = local_3b0 + 8;
      local_388 = 0;
      pcVar2 = *(char **)((long)local_420 + lVar13 * 0x18 + 8);
      local_2d0 = (undefined1  [8])local_2c0;
      local_390 = (_Base_ptr)local_3b0._24_8_;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"DECLARATIONSTR","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_3b0,(key_type *)local_2d0);
      pcVar9 = (char *)pmVar8->_M_string_length;
      strlen(pcVar2);
      std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar9,(ulong)pcVar2);
      if (local_2d0 != (undefined1  [8])local_2c0) {
        operator_delete((void *)local_2d0,local_2c0[0]._M_allocated_capacity + 1);
      }
      pcVar2 = *(char **)((long)local_420 + lVar13 * 0x18 + 0x10);
      local_2d0 = (undefined1  [8])local_2c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"ACCESSSTR","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_3b0,(key_type *)local_2d0);
      pcVar9 = (char *)pmVar8->_M_string_length;
      strlen(pcVar2);
      std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar9,(ulong)pcVar2);
      if (local_2d0 != (undefined1  [8])local_2c0) {
        operator_delete((void *)local_2d0,local_2c0[0]._M_allocated_capacity + 1);
      }
      bVar4 = this->m_extension != (char *)0x0;
      if (bVar4 && !bVar3) {
        local_338 = &local_328;
        local_330 = 0;
        local_328 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_338);
        local_380 = &local_370;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_370 = *plVar11;
          lStack_368 = plVar7[3];
        }
        else {
          local_370 = *plVar11;
          local_380 = (long *)*plVar7;
        }
        local_378 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_380);
        local_360 = &local_350;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_350 = *plVar11;
          lStack_348 = plVar7[3];
        }
        else {
          local_350 = *plVar11;
          local_360 = (long *)*plVar7;
        }
        local_358 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_360);
        local_2d0 = (undefined1  [8])local_2c0;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 == paVar12) {
          local_2c0[0]._0_8_ = paVar12->_M_allocated_capacity;
          local_2c0[0]._8_8_ = plVar7[3];
        }
        else {
          local_2c0[0]._0_8_ = paVar12->_M_allocated_capacity;
          local_2d0 = (undefined1  [8])*plVar7;
        }
        local_2c8 = (_func_int **)plVar7[1];
        *plVar7 = (long)paVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
      }
      else {
        local_2d0 = (undefined1  [8])local_2c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,0x1af8059);
      }
      local_150._0_8_ = local_150 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"EXTENSIONSTATEMENT","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_3b0,(key_type *)local_150);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)local_2d0);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      if (local_2d0 != (undefined1  [8])local_2c0) {
        operator_delete((void *)local_2d0,local_2c0[0]._M_allocated_capacity + 1);
      }
      if (bVar4 && !bVar3) {
        if (local_360 != &local_350) {
          operator_delete(local_360,local_350 + 1);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380,local_370 + 1);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,CONCAT71(uStack_327,local_328) + 1);
        }
      }
      CVar5.super_ApiType.m_bits =
           (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      version = glu::getContextTypeGLSLVersion(CVar5);
      pcVar9 = glu::getGLSLVersionDeclaration(version);
      local_2d0 = (undefined1  [8])local_2c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"VERSIONDECL","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_3b0,(key_type *)local_2d0);
      pcVar2 = (char *)pmVar8->_M_string_length;
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar2,(ulong)pcVar9);
      if (local_2d0 != (undefined1  [8])local_2c0) {
        operator_delete((void *)local_2d0,local_2c0[0]._M_allocated_capacity + 1);
      }
      local_150._0_8_ = local_150 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,
                 "${VERSIONDECL}\n${EXTENSIONSTATEMENT}${DECLARATIONSTR};\nlayout(location = 0) out highp vec4 dEQP_FragColor;\nvoid main(void)\n{\n\tdEQP_FragColor = vec4(${ACCESSSTR});\n}\n"
                 ,"");
      tcu::StringTemplate::StringTemplate((StringTemplate *)local_2d0,(string *)local_150);
      tcu::StringTemplate::specialize
                (&local_2f8,(StringTemplate *)local_2d0,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_3b0);
      tcu::StringTemplate::~StringTemplate((StringTemplate *)local_2d0);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      local_150._0_8_ = local_150 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,
                 "${VERSIONDECL}\nin highp vec4 a_position;\nvoid main(void)\n{\n\tgl_Position = a_position;\n}\n"
                 ,"");
      tcu::StringTemplate::StringTemplate((StringTemplate *)local_2d0,(string *)local_150);
      tcu::StringTemplate::specialize
                (&local_318,(StringTemplate *)local_2d0,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_3b0);
      tcu::StringTemplate::~StringTemplate((StringTemplate *)local_2d0);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar10 = CONCAT44(extraout_var,iVar6);
      renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
      memset((MessageBuilder *)local_2d0,0,0xac);
      local_220._0_8_ = (pointer)0x0;
      local_220[8] = 0;
      local_220._9_7_ = 0;
      local_220[0x10] = 0;
      local_220._17_8_ = 0;
      local_408._0_8_ = local_408._0_8_ & 0xffffffff00000000;
      local_408._8_8_ = local_3f8._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_408 + 8),local_318._M_dataplus._M_p,
                 local_318._M_dataplus._M_p + local_318._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2d0 + (local_408._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_408 + 8));
      local_3d8 = (code *)CONCAT44(local_3d8._4_4_,1);
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d0,local_2f8._M_dataplus._M_p,
                 local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2d0 + ((ulong)local_3d8 & 0xffffffff) * 0x18),&local_3d0);
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_150,renderCtx,(ProgramSources *)local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_408._8_8_ != local_3f8._M_local_buf + 8) {
        operator_delete((void *)local_408._8_8_,local_3f8._8_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_220);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_240);
      lVar15 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2d0 + lVar15));
        lVar15 = lVar15 + -0x18;
      } while (lVar15 != -0x18);
      local_2d0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2c8,"Building program with uniform sampler of type ",0x2e);
      local_408._0_8_ = glu::getShaderVarTypeName;
      local_408._8_4_ = *(int *)((long)local_420 + lVar13 * 0x18);
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_408,(ostream *)&local_2c8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c8);
      std::ios_base::~ios_base(local_258);
      if (local_90 == false) {
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        (ShaderProgram *)local_150);
        local_2d0 = (undefined1  [8])local_2c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2d0,"could not build shader","");
        tcu::ResultCollector::fail(&local_80,(string *)local_2d0);
LAB_014bc461:
        if (local_2d0 != (undefined1  [8])local_2c0) {
          operator_delete((void *)local_2d0,local_2c0[0]._M_allocated_capacity + 1);
        }
      }
      else {
        local_3d8 = (code *)((ulong)local_3d8 & 0xffffffff00000000);
        (**(code **)(lVar10 + 0x9d8))(local_b8,0x8b86,&local_3d8);
        if ((int)local_3d8 != 1) {
          local_2d0 = (undefined1  [8])local_2c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2d0,"Unexpected GL_ACTIVE_UNIFORMS, expected 1","");
          tcu::ResultCollector::fail(&local_80,(string *)local_2d0);
          goto LAB_014bc461;
        }
        local_3dc = 0;
        local_424 = 0;
        local_2d0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2c8,"Verifying uniform type.",0x17);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c8);
        std::ios_base::~ios_base(local_258);
        (**(code **)(lVar10 + 0x770))(local_b8,1,&local_3dc,0x8a37,&local_424);
        if (local_424 != *(int *)((long)local_420 + lVar13 * 0x18)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2d0,"Invalid type, expected ",0x17);
          this_00 = std::ostream::_M_insert<unsigned_long>((ulong)local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>(this_00,", got ",6);
          std::ostream::operator<<(this_00,local_424);
          std::__cxx11::stringbuf::str();
          tcu::ResultCollector::fail(&local_80,(string *)local_408);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._0_8_ != &local_3f8) {
            operator_delete((void *)local_408._0_8_,local_3f8._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
          std::ios_base::~ios_base(local_260);
        }
      }
      err = (**(code **)(lVar10 + 0x800))();
      glu::checkError(err,::glcts::fixed_sample_locations_values + 1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderStateQueryTests.cpp"
                      ,0x9c);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_3b0);
      tcu::TestLog::endSection(local_340.m_log);
      lVar13 = local_2d8 + 1;
    } while (lVar13 < (int)((ulong)(local_418 - (long)local_420) >> 3) * -0x55555555);
  }
  tcu::ResultCollector::setTestContextResult
            (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if (local_420 != (void *)0x0) {
    operator_delete(local_420,local_410 - (long)local_420);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

BaseTypeCase::IterateResult BaseTypeCase::iterate (void)
{
	static const char* const	vertexSourceTemplate	=	"${VERSIONDECL}\n"
															"in highp vec4 a_position;\n"
															"void main(void)\n"
															"{\n"
															"	gl_Position = a_position;\n"
															"}\n";
	static const char* const	fragmentSourceTemplate	=	"${VERSIONDECL}\n"
															"${EXTENSIONSTATEMENT}"
															"${DECLARATIONSTR};\n"
															"layout(location = 0) out highp vec4 dEQP_FragColor;\n"
															"void main(void)\n"
															"{\n"
															"	dEQP_FragColor = vec4(${ACCESSSTR});\n"
															"}\n";

	tcu::ResultCollector		result			(m_testCtx.getLog());
	std::vector<TestTypeInfo>	samplerTypes	= getInfos();
	const bool					supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (m_extension && !m_context.getContextInfo().isExtensionSupported(m_extension) && !supportsES32)
		throw tcu::NotSupportedError("Test requires " + std::string(m_extension));
	checkRequirements();

	for (int typeNdx = 0; typeNdx < (int)samplerTypes.size(); ++typeNdx)
	{
		const tcu::ScopedLogSection			section	(m_testCtx.getLog(),
													 std::string(glu::getShaderVarTypeStr(samplerTypes[typeNdx].glType).toString()),
													 "Uniform type " + glu::getShaderVarTypeStr(samplerTypes[typeNdx].glType).toString());

		std::map<std::string, std::string>	shaderArgs;
		shaderArgs["DECLARATIONSTR"]		= samplerTypes[typeNdx].declarationStr;
		shaderArgs["ACCESSSTR"]				= samplerTypes[typeNdx].accessStr;
		shaderArgs["EXTENSIONSTATEMENT"]	= (m_extension && !supportsES32) ? (std::string() + "#extension " + m_extension + " : require\n") : ("");
		shaderArgs["VERSIONDECL"]			= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()));

		const std::string					fragmentSource	= tcu::StringTemplate(fragmentSourceTemplate).specialize(shaderArgs);
		const std::string					vertexSource	= tcu::StringTemplate(vertexSourceTemplate).specialize(shaderArgs);
		const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
		glu::ShaderProgram					program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource) << glu::FragmentSource(fragmentSource));

		m_testCtx.getLog() << tcu::TestLog::Message << "Building program with uniform sampler of type " << glu::getShaderVarTypeStr(samplerTypes[typeNdx].glType) << tcu::TestLog::EndMessage;

		if (!program.isOk())
		{
			m_testCtx.getLog() << program;
			result.fail("could not build shader");
		}
		else
		{
			// only one uniform -- uniform at index 0
			int uniforms = 0;
			gl.getProgramiv(program.getProgram(), GL_ACTIVE_UNIFORMS, &uniforms);

			if (uniforms != 1)
				result.fail("Unexpected GL_ACTIVE_UNIFORMS, expected 1");
			else
			{
				// check type
				const glw::GLuint	uniformIndex	= 0;
				glw::GLint			type			= 0;

				m_testCtx.getLog() << tcu::TestLog::Message << "Verifying uniform type." << tcu::TestLog::EndMessage;
				gl.getActiveUniformsiv(program.getProgram(), 1, &uniformIndex, GL_UNIFORM_TYPE, &type);

				if (type != (glw::GLint)samplerTypes[typeNdx].glType)
				{
					std::ostringstream buf;
					buf << "Invalid type, expected " << samplerTypes[typeNdx].glType << ", got " << type;
					result.fail(buf.str());
				}
			}
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "");
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}